

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

Status __thiscall
flatbuffers::anon_unknown_7::TextCodeGenerator::GenerateCode
          (TextCodeGenerator *this,Parser *parser,string *path,string *filename)

{
  char *__s;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __s = GenTextFile(parser,path,filename);
  if (__s != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_71);
    std::operator+(&local_70," (",&local_50);
    std::operator+(&local_30,&local_70,")");
    std::__cxx11::string::operator=
              ((string *)&(this->super_CodeGenerator).status_detail,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return (uint)(__s != (char *)0x0);
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    auto err = GenTextFile(parser, path, filename);
    if (err) {
      status_detail = " (" + std::string(err) + ")";
      return Status::ERROR;
    }
    return Status::OK;
  }